

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

void __thiscall
dlib::tensor::
add_to_sample<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          (tensor *this,unsigned_long_long idx,
          matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
          *item)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  fatal_error *pfVar3;
  ostringstream dlib_o_out;
  string local_1b0;
  assignable_ptr_matrix<float> local_190;
  uint auStack_178 [88];
  
  if ((ulong)this->m_n <= idx) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"\n\nError detected at line ",0x19);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_190,0xab);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,
               "void dlib::tensor::add_to_sample(unsigned long long, const matrix_exp<EXP> &) [EXP = dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_trans<dlib::matrix<float>>>>]"
               ,0xd6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"idx < (unsigned long long)num_samples()",0x27);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n",2);
    *(uint *)((long)auStack_178 + *(long *)(local_190.ptr + -6)) =
         *(uint *)((long)auStack_178 + *(long *)(local_190.ptr + -6)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"\n",1);
    pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
  }
  if (*(long *)(**(long **)(item + 8) + 8) * *(long *)(*(long *)item + 8) -
      this->m_nc * this->m_nr * this->m_k == 0) {
    iVar1 = (*this->_vptr_tensor[3])();
    local_190.height = *(long *)(*(long *)item + 8);
    local_190.width = *(long *)(**(long **)(item + 8) + 8);
    local_190.ptr =
         (float *)(CONCAT44(extraout_var,iVar1) + idx * local_190.height * local_190.width * 4);
    assignable_ptr_matrix<float>::operator+=(&local_190,item);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_190,0xac);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
             ,0x73);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,
             "void dlib::tensor::add_to_sample(unsigned long long, const matrix_exp<EXP> &) [EXP = dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_trans<dlib::matrix<float>>>>]"
             ,0xd6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"item.size() == nr()*nc()*k()",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n",2);
  *(uint *)((long)auStack_178 + *(long *)(local_190.ptr + -6)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190.ptr + -6)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"\n",1);
  pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
}

Assistant:

void add_to_sample (
            unsigned long long idx,
            const matrix_exp<EXP>& item
        )
        {
            DLIB_CASSERT(idx < (unsigned long long)num_samples());
            DLIB_CASSERT(item.size() == nr()*nc()*k());
            static_assert((is_same_type<float, typename EXP::type>::value == true),
                "To assign a matrix to a tensor the matrix must contain float values");
            set_ptrm(host()+idx*item.size(), item.nr(), item.nc()) += item;
        }